

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O3

void symhash_add(D_SymHash *sh,D_Sym *s)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  D_Sym **ppDVar4;
  D_Sym *pDVar5;
  D_Sym **ppDVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  anon_struct_40_4_d8687ec6 tv;
  uint local_60 [2];
  ulong *local_58;
  ulong local_50 [4];
  
  uVar1 = (sh->syms).n;
  uVar8 = (ulong)s->hash % (ulong)uVar1;
  ppDVar4 = (sh->syms).v;
  iVar2 = sh->index;
  sh->index = iVar2 + 1;
  s->next = ppDVar4[uVar8];
  ppDVar4[uVar8] = s;
  uVar3 = sh->grow;
  local_50[3] = (ulong)uVar3;
  if ((int)uVar3 <= iVar2) {
    ppDVar4 = (sh->syms).v;
    (sh->syms).n = uVar3;
    sh->grow = uVar3 * 2 + 1;
    ppDVar6 = (D_Sym **)calloc(1,local_50[3] * 8);
    (sh->syms).v = ppDVar6;
    local_60[0] = 0;
    local_58 = (ulong *)0x0;
    uVar8 = (ulong)(uVar1 + (uVar1 == 0));
    uVar9 = 0;
LAB_00146fa9:
    do {
      pDVar5 = ppDVar4[uVar9];
      if (pDVar5 != (D_Sym *)0x0) {
        ppDVar4[uVar9] = pDVar5->next;
        if (local_58 == (ulong *)0x0) {
          uVar7 = (ulong)local_60[0];
          local_60[0] = local_60[0] + 1;
          local_50[uVar7] = (ulong)pDVar5;
          local_58 = local_50;
        }
        else {
          uVar7 = (ulong)local_60[0];
          if (local_58 == local_50) {
            if (2 < local_60[0]) goto LAB_00147001;
          }
          else if ((local_60[0] & 7) == 0) {
LAB_00147001:
            vec_add_internal(local_60,pDVar5);
            goto LAB_00146fa9;
          }
          local_60[0] = local_60[0] + 1;
          local_58[uVar7] = (ulong)pDVar5;
        }
        goto LAB_00146fa9;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
    pDVar5 = (D_Sym *)local_58[uVar8];
    while (pDVar5 != (D_Sym *)0x0) {
      local_58[uVar8] = (ulong)pDVar5->next;
      uVar9 = (ulong)pDVar5->hash % (local_50[3] & 0xffffffff);
      pDVar5->next = ppDVar6[uVar9];
      ppDVar6[uVar9] = pDVar5;
      pDVar5 = (D_Sym *)local_58[uVar8];
    }
    free(ppDVar4);
  }
  return;
}

Assistant:

static void symhash_add(D_SymHash *sh, D_Sym *s) {
  uint i, h = s->hash % sh->syms.n, n;
  D_Sym **v = sh->syms.v, *x;
  Vec(D_Sym *) vv, tv;

  sh->index++;
  s->next = v[h];
  v[h] = s;

  if (sh->index > sh->grow) {
    vv.v = sh->syms.v;
    vv.n = sh->syms.n;
    sh->syms.n = sh->grow;
    sh->grow = sh->grow * 2 + 1;
    sh->syms.v = MALLOC(sh->syms.n * sizeof(void *));
    memset(sh->syms.v, 0, sh->syms.n * sizeof(void *));
    v = sh->syms.v;
    n = sh->syms.n;
    vec_clear(&tv);
    for (i = 0; i < vv.n; i++) /* use temporary to preserve order */
      while (vv.v[i]) {
        x = vv.v[i];
        vv.v[i] = x->next;
        vec_add(&tv, x);
      }
    while (tv.v[i]) {
      x = tv.v[i];
      tv.v[i] = x->next;
      h = x->hash % n;
      x->next = v[h];
      v[h] = x;
    }
    FREE(vv.v);
  }
}